

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

CameraSample *
pbrt::GetCameraSample<pbrt::SamplerHandle>
          (CameraSample *__return_storage_ptr__,SamplerHandle *sampler,Point2i *pPixel,
          FilterHandle *filter)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  DebugMLTSampler *pDVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Float FVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar23 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar22 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [64];
  FilterSample FVar26;
  DispatchSplit<8> local_69;
  undefined1 local_68 [16];
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_50;
  Float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 auVar25 [60];
  
  auVar25 = in_ZMM1._4_60_;
  uVar3 = (sampler->
          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  uVar6 = (uint)(ushort)(uVar3 >> 0x30);
  if (uVar3 >> 0x30 < 5) {
    if (uVar3 < 0x3000000000000) {
      if (uVar6 == 2) {
        auVar13._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar3 & 0xffffffffffff));
        auVar13._8_56_ = extraout_var_01;
      }
      else {
        auVar13._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar3 & 0xffffffffffff));
        auVar13._8_56_ = extraout_var_05;
      }
    }
    else if ((uVar6 & 6) == 2) {
      auVar13._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar3 & 0xffffffffffff));
      auVar13._8_56_ = extraout_var_03;
    }
    else {
      auVar13._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar3 & 0xffffffffffff));
      auVar13._8_56_ = extraout_var_07;
    }
  }
  else {
    uVar6 = uVar6 - 4;
    if (uVar6 < 3) {
      if (uVar6 == 2) {
        auVar13._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar3 & 0xffffffffffff));
        auVar13._8_56_ = extraout_var_02;
      }
      else {
        auVar13._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar3 & 0xffffffffffff));
        auVar13._8_56_ = extraout_var_06;
      }
    }
    else {
      pDVar7 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
      if ((uVar6 & 0x7ffffffe) == 2) {
        auVar13._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar7);
        auVar13._8_56_ = extraout_var_04;
      }
      else {
        local_68._0_4_ = DebugMLTSampler::Get1D(pDVar7);
        local_68._4_4_ = extraout_XMM0_Db;
        local_68._8_4_ = extraout_XMM0_Dc;
        local_68._12_4_ = extraout_XMM0_Dd;
        auVar12._0_4_ = DebugMLTSampler::Get1D(pDVar7);
        auVar12._4_60_ = extraout_var;
        auVar25 = ZEXT1260(local_68._4_12_);
        auVar8 = vinsertps_avx(local_68,auVar12._0_16_,0x10);
        auVar13 = ZEXT1664(auVar8);
      }
    }
  }
  auVar23 = auVar13._8_56_;
  local_50.bits = vmovlps_avx(auVar13._0_16_);
  FVar26 = TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
           ::
           Dispatch<pbrt::FilterHandle::Sample(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                       *)filter,(Point2f *)&local_50);
  auVar24._0_4_ = FVar26.weight;
  auVar24._4_60_ = auVar25;
  auVar14._0_8_ = FVar26.p.super_Tuple2<pbrt::Point2,_float>;
  auVar14._8_56_ = auVar23;
  local_68 = auVar24._0_16_;
  auVar8._0_12_ = ZEXT412(0);
  auVar8._12_4_ = 0;
  bVar2 = *(byte *)(Options + 0xc);
  if (bVar2 == 0) {
    auVar8 = auVar14._0_16_;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pPixel->super_Tuple2<pbrt::Point2,_int>;
  auVar4 = vcvtdq2ps_avx(auVar10);
  auVar11._0_4_ = auVar8._0_4_ + auVar4._0_4_;
  auVar11._4_4_ = auVar8._4_4_ + auVar4._4_4_;
  auVar11._8_4_ = auVar8._8_4_ + auVar4._8_4_;
  auVar11._12_4_ = auVar8._12_4_ + auVar4._12_4_;
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  auVar8 = vaddps_avx512vl(auVar11,auVar4);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar8);
  (__return_storage_ptr__->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar1;
  local_50.bits =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar9 = detail::DispatchSplit<8>::operator()(&local_69,&local_50,local_50.bits >> 0x30);
  __return_storage_ptr__->time = FVar9;
  uVar3 = (sampler->
          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  uVar6 = (uint)(ushort)(uVar3 >> 0x30);
  if (uVar3 < 0x5000000000000) {
    if (uVar3 < 0x3000000000000) {
      if (uVar6 == 2) {
        auVar15._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar3 & 0xffffffffffff));
        auVar15._8_56_ = extraout_var_08;
        auVar8 = auVar15._0_16_;
      }
      else {
        auVar19._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar3 & 0xffffffffffff));
        auVar19._8_56_ = extraout_var_12;
        auVar8 = auVar19._0_16_;
      }
    }
    else if ((uVar6 & 6) == 2) {
      auVar17._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar3 & 0xffffffffffff));
      auVar17._8_56_ = extraout_var_10;
      auVar8 = auVar17._0_16_;
    }
    else {
      auVar21._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar3 & 0xffffffffffff));
      auVar21._8_56_ = extraout_var_14;
      auVar8 = auVar21._0_16_;
    }
  }
  else {
    uVar6 = uVar6 - 4;
    if (uVar6 < 3) {
      if (uVar6 == 2) {
        auVar16._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar3 & 0xffffffffffff));
        auVar16._8_56_ = extraout_var_09;
        auVar8 = auVar16._0_16_;
      }
      else {
        auVar20._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar3 & 0xffffffffffff));
        auVar20._8_56_ = extraout_var_13;
        auVar8 = auVar20._0_16_;
      }
    }
    else {
      pDVar7 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
      if ((uVar6 & 0x7ffffffe) == 2) {
        auVar18._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar7);
        auVar18._8_56_ = extraout_var_11;
        auVar8 = auVar18._0_16_;
      }
      else {
        local_48 = DebugMLTSampler::Get1D(pDVar7);
        uStack_44 = extraout_XMM0_Db_00;
        uStack_40 = extraout_XMM0_Dc_00;
        uStack_3c = extraout_XMM0_Dd_00;
        auVar22._0_4_ = DebugMLTSampler::Get1D(pDVar7);
        auVar22._4_60_ = extraout_var_00;
        auVar5._4_4_ = uStack_44;
        auVar5._0_4_ = local_48;
        auVar5._8_4_ = uStack_40;
        auVar5._12_4_ = uStack_3c;
        auVar8 = vinsertps_avx(auVar5,auVar22._0_16_,0x10);
      }
    }
  }
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar8);
  (__return_storage_ptr__->pLens).super_Tuple2<pbrt::Point2,_float> = TVar1;
  __return_storage_ptr__->weight =
       (Float)((uint)(bVar2 & 1) * 0x3f800000 + (uint)!(bool)(bVar2 & 1) * local_68._0_4_);
  return __return_storage_ptr__;
}

Assistant:

inline PBRT_CPU_GPU CameraSample GetCameraSample(Sampler sampler, const Point2i &pPixel,
                                                 FilterHandle filter) {
    FilterSample fs = filter.Sample(sampler.Get2D());
    if (GetOptions().disablePixelJitter) {
        fs.p = Point2f(0, 0);
        fs.weight = 1;
    }

    CameraSample cs;
    cs.pFilm = pPixel + fs.p + Vector2f(0.5, 0.5);
    cs.time = sampler.Get1D();
    cs.pLens = sampler.Get2D();
    cs.weight = fs.weight;
    return cs;
}